

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O1

CURLcode mqtt_verify_connack(Curl_easy *data)

{
  CURLcode CVar1;
  void *pvVar2;
  char *ptr;
  
  pvVar2 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  if (pvVar2 == (void *)0x0) {
    CVar1 = CURLE_FAILED_INIT;
  }
  else {
    CVar1 = mqtt_recv_atleast(data,2);
    if (CVar1 == CURLE_OK) {
      ptr = Curl_dyn_ptr((dynbuf *)((long)pvVar2 + 0x20));
      Curl_debug(data,CURLINFO_HEADER_IN,ptr,2);
      if (((int)*ptr == 0) && (ptr[1] == '\0')) {
        mqtt_recv_consume(data,2);
        CVar1 = CURLE_OK;
      }
      else {
        Curl_failf(data,"Expected %02x%02x but got %02x%02x",0,0,(ulong)(uint)(int)*ptr,
                   (ulong)(uint)(int)ptr[1]);
        Curl_dyn_reset((dynbuf *)((long)pvVar2 + 0x20));
        CVar1 = CURLE_WEIRD_SERVER_REPLY;
      }
    }
  }
  return CVar1;
}

Assistant:

static CURLcode mqtt_verify_connack(struct Curl_easy *data)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  CURLcode result;
  char *ptr;

  DEBUGASSERT(mq);
  if(!mq)
    return CURLE_FAILED_INIT;

  result = mqtt_recv_atleast(data, MQTT_CONNACK_LEN);
  if(result)
    goto fail;

  /* verify CONNACK */
  DEBUGASSERT(Curl_dyn_len(&mq->recvbuf) >= MQTT_CONNACK_LEN);
  ptr = Curl_dyn_ptr(&mq->recvbuf);
  Curl_debug(data, CURLINFO_HEADER_IN, ptr, MQTT_CONNACK_LEN);

  if(ptr[0] != 0x00 || ptr[1] != 0x00) {
    failf(data, "Expected %02x%02x but got %02x%02x",
          0x00, 0x00, ptr[0], ptr[1]);
    Curl_dyn_reset(&mq->recvbuf);
    result = CURLE_WEIRD_SERVER_REPLY;
    goto fail;
  }
  mqtt_recv_consume(data, MQTT_CONNACK_LEN);
fail:
  return result;
}